

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

stbi_uc * stbi_load_from_memory(stbi_uc *buffer,int len,int *x,int *y,int *comp,int req_comp)

{
  uchar *puVar1;
  int in_ESI;
  stbi_uc *in_RDI;
  stbi__context s;
  int in_stack_ffffffffffffff3c;
  int *in_stack_ffffffffffffff40;
  int *in_stack_ffffffffffffff48;
  int *in_stack_ffffffffffffff50;
  stbi__context *in_stack_ffffffffffffff58;
  
  stbi__start_mem((stbi__context *)&stack0xfffffffffffffef8,in_RDI,in_ESI);
  puVar1 = stbi__load_and_postprocess_8bit
                     (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                      in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
  return puVar1;
}

Assistant:

STBIDEF stbi_uc *stbi_load_from_memory(stbi_uc const *buffer, int len, int *x, int *y, int *comp, int req_comp)
{
   stbi__context s;
   stbi__start_mem(&s,buffer,len);
   return stbi__load_and_postprocess_8bit(&s,x,y,comp,req_comp);
}